

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::SwizzleTestBase<3U,_32849U>::~SwizzleTestBase
          (SwizzleTestBase<3U,_32849U> *this)

{
  WriterTestHelper<unsigned_char,_3U,_32849U> *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__SwizzleTestBase_00219198;
  WriterTestHelper<unsigned_char,_3U,_32849U>::~WriterTestHelper(in_RDI);
  testing::Test::~Test((Test *)0x154034);
  return;
}

Assistant:

SwizzleTestBase() {
        std::vector<GLubyte> color;
        // Use swizzle enumerator values for easy checking of result.
        std::vector<GLubyte> defaultColor = { R, G, B, A };
        color.resize(num_components);
        for (uint32_t i = 0; i < num_components; i++) {
            color[i] = defaultColor[i];
        }
        helper.resize(createFlagBits::eNone, 1, 1, 2, width, height, 1, &color);
    }